

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::JunitReporter::StartTestCase(JunitReporter *this,TestCaseInfo *testInfo)

{
  Stats *pSVar1;
  TestCaseStats local_90;
  
  pSVar1 = this->m_currentStats;
  TestCaseStats::TestCaseStats(&local_90,&testInfo->m_className,&testInfo->m_name);
  std::
  vector<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
  ::emplace_back<Catch::JunitReporter::TestCaseStats>(&pSVar1->m_testCaseStats,&local_90);
  std::vector<Catch::JunitReporter::TestStats,_std::allocator<Catch::JunitReporter::TestStats>_>::
  ~vector(&local_90.m_testStats);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_name._M_dataplus._M_p != &local_90.m_name.field_2) {
    operator_delete(local_90.m_name._M_dataplus._M_p,
                    local_90.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_className._M_dataplus._M_p != &local_90.m_className.field_2) {
    operator_delete(local_90.m_className._M_dataplus._M_p,
                    local_90.m_className.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_status._M_dataplus._M_p != &local_90.m_status.field_2) {
    operator_delete(local_90.m_status._M_dataplus._M_p,
                    local_90.m_status.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

virtual void StartTestCase( const Catch::TestCaseInfo& testInfo ) {
            m_currentStats->m_testCaseStats.push_back( TestCaseStats( testInfo.getClassName(), testInfo.getName() ) );
        }